

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O1

void duckdb::UncompressedStringStorage::StringFetchRow
               (ColumnSegment *segment,ColumnFetchState *state,row_t row_id,Vector *result,
               idx_t result_idx)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  idx_t iVar4;
  long lVar5;
  Vector *result_00;
  BufferHandle *pBVar6;
  int iVar7;
  uint uVar8;
  data_ptr_t pdVar9;
  undefined1 local_50 [16];
  data_ptr_t local_40;
  Vector *local_38;
  
  local_38 = result;
  pBVar6 = ColumnFetchState::GetOrInsertHandle(state,segment);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&pBVar6->node);
  pdVar9 = ((pBVar6->node).ptr)->buffer;
  iVar4 = segment->offset;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&pBVar6->node);
  result_00 = local_38;
  uVar1 = *(uint *)(((pBVar6->node).ptr)->buffer + segment->offset + 4);
  uVar2 = *(uint *)(pdVar9 + row_id * 4 + iVar4 + 8);
  uVar8 = -uVar2;
  if (0 < (int)uVar2) {
    uVar8 = uVar2;
  }
  if (row_id != 0) {
    iVar3 = *(int *)(pdVar9 + row_id * 4 + iVar4 + 4);
    iVar7 = -iVar3;
    if (iVar3 < 1) {
      iVar7 = iVar3;
    }
    uVar8 = uVar8 + iVar7;
  }
  local_40 = local_38->data;
  uVar8 = NumericCastImpl<unsigned_int,_int,_false>::Convert(uVar8);
  lVar5 = uVar1 + iVar4;
  if ((int)uVar2 < 0) {
    local_50 = (undefined1  [16])
               ReadOverflowString(segment,result_00,
                                  *(block_id_t *)(pdVar9 + (lVar5 - (ulong)-uVar2)),
                                  (int32_t)*(block_id_t *)
                                            ((long)(pdVar9 + (lVar5 - (ulong)-uVar2)) + 8));
  }
  else {
    pdVar9 = pdVar9 + (lVar5 - (ulong)uVar2);
    if (uVar8 < 0xd) {
      local_50 = ZEXT416(uVar8);
      if (uVar8 != 0) {
        switchD_012e1ce8::default(local_50 + 4,pdVar9,(ulong)uVar8);
      }
    }
    else {
      local_50._4_4_ = *(undefined4 *)pdVar9;
      local_50._0_4_ = uVar8;
      local_50._8_8_ = pdVar9;
    }
  }
  *(undefined8 *)(local_40 + result_idx * 0x10) = local_50._0_8_;
  *(undefined8 *)(local_40 + result_idx * 0x10 + 8) = local_50._8_8_;
  return;
}

Assistant:

void UncompressedStringStorage::StringFetchRow(ColumnSegment &segment, ColumnFetchState &state, row_t row_id,
                                               Vector &result, idx_t result_idx) {
	// fetch a single row from the string segment
	// first pin the main buffer if it is not already pinned
	auto &handle = state.GetOrInsertHandle(segment);

	auto baseptr = handle.Ptr() + segment.GetBlockOffset();
	auto dict_end = GetDictionaryEnd(segment, handle);
	auto base_data = reinterpret_cast<int32_t *>(baseptr + DICTIONARY_HEADER_SIZE);
	auto result_data = FlatVector::GetData<string_t>(result);

	auto dict_offset = base_data[row_id];
	uint32_t string_length;
	if (DUCKDB_UNLIKELY(row_id == 0LL)) {
		// edge case where this is the first string in the dict
		string_length = NumericCast<uint32_t>(std::abs(dict_offset));
	} else {
		string_length = NumericCast<uint32_t>(std::abs(dict_offset) - std::abs(base_data[row_id - 1]));
	}
	result_data[result_idx] = FetchStringFromDict(segment, dict_end, result, baseptr, dict_offset, string_length);
}